

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O0

vm_obj_id_t CVmObjByteArray::create_from_bytes(int in_root_set,char *buf,size_t len)

{
  vm_obj_id_t vVar1;
  CVmObject *cnt;
  uchar *in_RDX;
  CVmObjByteArray *in_RSI;
  CVmObjByteArray *arr;
  vm_obj_id_t id;
  unsigned_long in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffe4;
  
  vVar1 = create(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8);
  cnt = vm_objp(0);
  cons_copy_from_buf(in_RSI,in_RDX,CONCAT44(vVar1,in_stack_ffffffffffffffe0),(size_t)cnt);
  return vVar1;
}

Assistant:

vm_obj_id_t CVmObjByteArray::create_from_bytes(
    VMG_ int in_root_set, const char *buf, size_t len)
{
    /* allocate the array */
    vm_obj_id_t id = create(vmg_ in_root_set, len);
    CVmObjByteArray *arr = (CVmObjByteArray *)vm_objp(vmg_ id);

    /* copy the bytes into the array */
    arr->cons_copy_from_buf((const unsigned char *)buf, 1, len);

    /* return the new array's object ID */
    return id;
}